

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeEventPoolPutIpcHandle(ze_context_handle_t hContext,ze_ipc_event_pool_handle_t hIpc)

{
  ze_result_t zVar1;
  
  if (DAT_0010d580 != (code *)0x0) {
    zVar1 = (*DAT_0010d580)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolPutIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object associated with the IPC event pool
                                                        ///< handle
        ze_ipc_event_pool_handle_t hIpc                 ///< [in] IPC event pool handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnPutIpcHandle = context.zeDdiTable.EventPool.pfnPutIpcHandle;
        if( nullptr != pfnPutIpcHandle )
        {
            result = pfnPutIpcHandle( hContext, hIpc );
        }
        else
        {
            // generic implementation
        }

        return result;
    }